

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_CCtx_params *
ZSTD_assignParamsToCCtxParams
          (ZSTD_CCtx_params *__return_storage_ptr__,ZSTD_CCtx_params *cctxParams,
          ZSTD_parameters *params)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ZSTD_strategy ZVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  memcpy(__return_storage_ptr__,cctxParams,0x90);
  auVar2._0_4_ = (params->cParams).windowLog;
  auVar2._4_4_ = (params->cParams).chainLog;
  auVar2._8_4_ = (params->cParams).hashLog;
  auVar2._12_4_ = (params->cParams).searchLog;
  auVar2 = vpaddd_avx(auVar2,_DAT_001a1300);
  auVar3 = vpminud_avx(auVar2,_DAT_001a1310);
  auVar2 = vpcmpeqd_avx(auVar2,auVar3);
  if (((((((auVar2 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
          (auVar2 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar2 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar2[0xf]) &&
       (0xfffffffa < (params->cParams).minMatch - 8)) && ((params->cParams).targetLength < 0x20001))
     && (0xfffffff6 < (params->cParams).strategy + ~ZSTD_btultra2)) {
    uVar6 = (params->cParams).windowLog;
    uVar7 = (params->cParams).chainLog;
    uVar8 = (params->cParams).hashLog;
    uVar9 = (params->cParams).searchLog;
    uVar1 = (params->cParams).minMatch;
    uVar4 = (params->cParams).targetLength;
    ZVar5 = (params->cParams).strategy;
    (__return_storage_ptr__->cParams).searchLog = (params->cParams).searchLog;
    (__return_storage_ptr__->cParams).minMatch = uVar1;
    (__return_storage_ptr__->cParams).targetLength = uVar4;
    (__return_storage_ptr__->cParams).strategy = ZVar5;
    (__return_storage_ptr__->cParams).windowLog = uVar6;
    (__return_storage_ptr__->cParams).chainLog = uVar7;
    (__return_storage_ptr__->cParams).hashLog = uVar8;
    (__return_storage_ptr__->cParams).searchLog = uVar9;
    iVar10 = (params->fParams).checksumFlag;
    (__return_storage_ptr__->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
    (__return_storage_ptr__->fParams).checksumFlag = iVar10;
    uVar1 = (params->fParams).noDictIDFlag;
    (__return_storage_ptr__->fParams).noDictIDFlag = uVar1;
    __return_storage_ptr__->compressionLevel = 3;
    return (ZSTD_CCtx_params *)(ulong)uVar1;
  }
  __assert_fail("!ZSTD_checkCParams(params->cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2b4d,
                "ZSTD_CCtx_params ZSTD_assignParamsToCCtxParams(const ZSTD_CCtx_params *, const ZSTD_parameters *)"
               );
}

Assistant:

static ZSTD_CCtx_params ZSTD_assignParamsToCCtxParams(
        const ZSTD_CCtx_params* cctxParams, const ZSTD_parameters* params)
{
    ZSTD_CCtx_params ret = *cctxParams;
    assert(!ZSTD_checkCParams(params->cParams));
    ret.cParams = params->cParams;
    ret.fParams = params->fParams;
    ret.compressionLevel = ZSTD_CLEVEL_DEFAULT;   /* should not matter, as all cParams are presumed properly defined */
    return ret;
}